

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-oid.c
# Opt level: O0

void bson_oid_init_from_string(bson_oid_t *oid,char *str)

{
  char *str_local;
  bson_oid_t *oid_local;
  
  if (oid == (bson_oid_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-oid.c"
            ,0xe9,"bson_oid_init_from_string","oid");
    abort();
  }
  if (str == (char *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-oid.c"
            ,0xea,"bson_oid_init_from_string","str");
    abort();
  }
  bson_oid_init_from_string_unsafe(oid,str);
  return;
}

Assistant:

void
bson_oid_init_from_string (bson_oid_t *oid, /* OUT */
                           const char *str) /* IN */
{
   BSON_ASSERT (oid);
   BSON_ASSERT (str);

   bson_oid_init_from_string_unsafe (oid, str);
}